

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_q.c
# Opt level: O1

float64 best_q(float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,
              uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,uint32 **dfeat,
              uint32 n_dfeat,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 *id,uint32 n_id,
              float32 ***dist,float64 node_wt_ent,quest_t **out_best_q)

{
  uint uVar1;
  float32 *pfVar2;
  float *pfVar3;
  float32 *pfVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  cmd_ln_t *pcVar8;
  char *__s1;
  ulong uVar9;
  undefined8 *inptr;
  undefined8 *inptr_00;
  ulong uVar10;
  void *ptr;
  void *ptr_00;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  quest_t *pqVar14;
  uint uVar15;
  long lVar16;
  size_t __n;
  ulong d2;
  ulong d1;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float64 fVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  ulong local_f0;
  uint local_e8;
  uint local_e4;
  double local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  uint local_ac;
  uint local_a8;
  float local_a4;
  ulong local_a0;
  double local_98;
  ulong local_90;
  
  pcVar8 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar8,"-ts2cbfn");
  iVar6 = strcmp(__s1,".semi.");
  if ((iVar6 != 0) && (iVar6 = strcmp(__s1,".cont."), iVar6 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
            ,0x67,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
    exit(1);
  }
  iVar6 = strcmp(__s1,".cont.");
  uVar18 = 0;
  d1 = (ulong)n_state;
  d2 = (ulong)n_stream;
  if (iVar6 == 0) {
    pcVar8 = cmd_ln_get();
    dVar24 = cmd_ln_float_r(pcVar8,"-varfloor");
    if (n_stream == 0) {
      uVar15 = 0;
    }
    else {
      uVar9 = 0;
      uVar15 = 0;
      do {
        uVar15 = uVar15 + veclen[uVar9];
        uVar9 = uVar9 + 1;
      } while (d2 != uVar9);
    }
    local_a0 = (ulong)uVar15;
    local_a4 = (float)dVar24;
    local_b8 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,local_a0,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x71);
    local_c0 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,local_a0,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x72);
    local_c8 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,local_a0,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x73);
    local_d0 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,local_a0,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x74);
  }
  else {
    local_a4 = 0.0;
    local_c8 = (undefined8 *)0x0;
    local_d0 = (undefined8 *)0x0;
    local_c0 = (undefined8 *)0x0;
    local_b8 = (undefined8 *)0x0;
    local_a0 = 0;
  }
  uVar9 = (ulong)n_density;
  inptr = (undefined8 *)
          __ckd_calloc_3d__(d1,d2,uVar9,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                            ,0x79);
  inptr_00 = (undefined8 *)
             __ckd_calloc_3d__(d1,d2,uVar9,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                               ,0x7a);
  if (n_all_q == 0) {
    local_98 = -1e+50;
    local_a8 = 0;
    local_ac = 0;
  }
  else {
    lVar16 = d1 * d2 * 4;
    sVar11 = local_a0 * lVar16;
    __n = lVar16 * uVar9;
    bVar20 = n_state == 0;
    local_90 = 0;
    local_98 = -1e+50;
    local_ac = 0;
    local_a8 = 0;
    uVar18 = 0;
    do {
      memset(*(void **)*inptr,0,__n);
      memset(*(void **)*inptr_00,0,__n);
      if (iVar6 == 0) {
        memset(*(void **)*local_b8,0,sVar11);
        memset(*(void **)*local_c0,0,sVar11);
        memset(*(void **)*local_c8,0,sVar11);
        memset(*(void **)*local_d0,0,sVar11);
      }
      if (n_id == 0) {
        local_e4 = 0;
        local_e8 = 0;
      }
      else {
        uVar13 = 0;
        local_e8 = 0;
        local_e4 = 0;
        do {
          uVar15 = id[uVar13];
          iVar7 = eval_quest(all_q + local_90,dfeat[uVar15],n_dfeat);
          if (iVar7 == 0) {
            if (n_state != 0) {
              uVar10 = 0;
              do {
                if (n_stream != 0) {
                  uVar12 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar2 = mixw[uVar15][uVar10][uVar12];
                      lVar16 = *(long *)(inptr_00[uVar10] + uVar12 * 8);
                      uVar17 = 0;
                      do {
                        *(float *)(lVar16 + uVar17 * 4) =
                             (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                        uVar17 = uVar17 + 1;
                      } while (uVar9 != uVar17);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != d2);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d1);
            }
            if (iVar6 == 0 && !bVar20) {
              uVar10 = 0;
              do {
                if (n_stream != 0) {
                  uVar12 = 0;
                  do {
                    uVar1 = veclen[uVar12];
                    if ((ulong)uVar1 != 0) {
                      pfVar3 = (float *)mixw[uVar15][uVar10][uVar12];
                      pfVar2 = means[uVar15][uVar10][uVar12];
                      lVar16 = *(long *)(local_c8[uVar10] + uVar12 * 8);
                      pfVar4 = vars[uVar15][uVar10][uVar12];
                      lVar5 = *(long *)(local_d0[uVar10] + uVar12 * 8);
                      uVar17 = 0;
                      do {
                        *(float *)(lVar16 + uVar17 * 4) =
                             *pfVar3 * (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                        fVar21 = (float)pfVar2[uVar17];
                        *(float *)(lVar5 + uVar17 * 4) =
                             (fVar21 * fVar21 + (float)pfVar4[uVar17]) * *pfVar3 +
                             *(float *)(lVar5 + uVar17 * 4);
                        uVar17 = uVar17 + 1;
                      } while (uVar1 != uVar17);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != d2);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d1);
            }
            local_e8 = local_e8 + 1;
          }
          else {
            if (n_state != 0) {
              uVar10 = 0;
              do {
                if (n_stream != 0) {
                  uVar12 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar2 = mixw[uVar15][uVar10][uVar12];
                      lVar16 = *(long *)(inptr[uVar10] + uVar12 * 8);
                      uVar17 = 0;
                      do {
                        *(float *)(lVar16 + uVar17 * 4) =
                             (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                        uVar17 = uVar17 + 1;
                      } while (uVar9 != uVar17);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != d2);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d1);
            }
            if (iVar6 == 0 && !bVar20) {
              uVar10 = 0;
              do {
                if (n_stream != 0) {
                  uVar12 = 0;
                  do {
                    uVar1 = veclen[uVar12];
                    if ((ulong)uVar1 != 0) {
                      pfVar3 = (float *)mixw[uVar15][uVar10][uVar12];
                      pfVar2 = means[uVar15][uVar10][uVar12];
                      lVar16 = *(long *)(local_b8[uVar10] + uVar12 * 8);
                      pfVar4 = vars[uVar15][uVar10][uVar12];
                      lVar5 = *(long *)(local_c0[uVar10] + uVar12 * 8);
                      uVar17 = 0;
                      do {
                        *(float *)(lVar16 + uVar17 * 4) =
                             *pfVar3 * (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                        fVar21 = (float)pfVar2[uVar17];
                        *(float *)(lVar5 + uVar17 * 4) =
                             (fVar21 * fVar21 + (float)pfVar4[uVar17]) * *pfVar3 +
                             *(float *)(lVar5 + uVar17 * 4);
                        uVar17 = uVar17 + 1;
                      } while (uVar1 != uVar17);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != d2);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d1);
            }
            local_e4 = local_e4 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != n_id);
      }
      if (local_e8 != 0 && local_e4 != 0) {
        dVar24 = 0.0;
        bVar19 = bVar20;
        if (n_state != 0) {
          uVar13 = 0;
          do {
            dVar25 = 0.0;
            if (n_density != 0) {
              uVar10 = 0;
              do {
                dVar25 = dVar25 + (double)*(float *)(*(long *)inptr[uVar13] + uVar10 * 4);
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
            if ((dVar25 == 0.0) && (!NAN(dVar25))) break;
            dVar27 = 1.0 / dVar25;
            if (n_stream != 0) {
              uVar10 = 0;
              do {
                if (n_density != 0) {
                  lVar16 = *(long *)(inptr[uVar13] + uVar10 * 8);
                  uVar12 = 0;
                  do {
                    *(float *)(lVar16 + uVar12 * 4) =
                         (float)((double)*(float *)(lVar16 + uVar12 * 4) * dVar27);
                    uVar12 = uVar12 + 1;
                  } while (uVar9 != uVar12);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d2);
            }
            if (n_density == 0) {
              dVar28 = 0.0;
            }
            else {
              dVar28 = 0.0;
              uVar10 = 0;
              do {
                dVar28 = dVar28 + (double)*(float *)(*(long *)inptr_00[uVar13] + uVar10 * 4);
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
            if ((dVar28 == 0.0) && (!NAN(dVar28))) break;
            dVar29 = 1.0 / dVar28;
            if (n_stream != 0) {
              uVar10 = 0;
              do {
                if (n_density != 0) {
                  lVar16 = *(long *)(inptr_00[uVar13] + uVar10 * 8);
                  uVar12 = 0;
                  do {
                    *(float *)(lVar16 + uVar12 * 4) =
                         (float)((double)*(float *)(lVar16 + uVar12 * 4) * dVar29);
                    uVar12 = uVar12 + 1;
                  } while (uVar9 != uVar12);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != d2);
            }
            if (iVar6 == 0) {
              if (n_stream == 0) {
                local_d8 = 0.0;
              }
              else {
                dVar26 = 0.0;
                uVar10 = 0;
                local_d8 = 0.0;
                do {
                  uVar15 = veclen[uVar10];
                  uVar12 = (ulong)uVar15;
                  if (uVar12 != 0) {
                    lVar16 = *(long *)(local_b8[uVar13] + uVar10 * 8);
                    lVar5 = *(long *)(local_c0[uVar13] + uVar10 * 8);
                    uVar17 = 0;
                    do {
                      fVar21 = (float)((double)*(float *)(lVar16 + uVar17 * 4) * dVar27);
                      *(float *)(lVar16 + uVar17 * 4) = fVar21;
                      fVar22 = (float)((double)*(float *)(lVar5 + uVar17 * 4) * dVar27 -
                                      (double)(fVar21 * fVar21));
                      fVar21 = local_a4;
                      if (local_a4 <= fVar22) {
                        fVar21 = fVar22;
                      }
                      *(float *)(lVar5 + uVar17 * 4) = fVar21;
                      uVar17 = uVar17 + 1;
                    } while (uVar12 != uVar17);
                  }
                  if (uVar12 != 0) {
                    lVar16 = *(long *)(local_c8[uVar13] + uVar10 * 8);
                    lVar5 = *(long *)(local_d0[uVar13] + uVar10 * 8);
                    uVar17 = 0;
                    do {
                      fVar21 = (float)((double)*(float *)(lVar16 + uVar17 * 4) * dVar29);
                      *(float *)(lVar16 + uVar17 * 4) = fVar21;
                      fVar22 = (float)((double)*(float *)(lVar5 + uVar17 * 4) * dVar29 -
                                      (double)(fVar21 * fVar21));
                      fVar21 = local_a4;
                      if (local_a4 <= fVar22) {
                        fVar21 = fVar22;
                      }
                      *(float *)(lVar5 + uVar17 * 4) = fVar21;
                      uVar17 = uVar17 + 1;
                    } while (uVar12 != uVar17);
                  }
                  fVar23 = ent_cont(*(float32 **)(local_b8[uVar13] + uVar10 * 8),
                                    *(float32 **)(local_c0[uVar13] + uVar10 * 8),uVar15);
                  local_d8 = local_d8 + (double)fVar23 * dVar25;
                  fVar23 = ent_cont(*(float32 **)(local_c8[uVar13] + uVar10 * 8),
                                    *(float32 **)(local_d0[uVar13] + uVar10 * 8),veclen[uVar10]);
                  dVar26 = dVar26 + (double)fVar23 * dVar28;
                  uVar10 = uVar10 + 1;
                } while (uVar10 != d2);
                local_d8 = local_d8 + dVar26;
              }
              local_d8 = (double)(float)stwt[uVar13] * local_d8;
            }
            else {
              fVar21 = (float)stwt[uVar13];
              fVar23 = wt_ent_inc((float32 **)inptr[uVar13],(float32)(float)dVar25,
                                  (float32 **)inptr_00[uVar13],(float32)(float)dVar28,dist[uVar13],
                                  n_stream,n_density);
              local_d8 = (double)fVar23 * (double)fVar21;
            }
            dVar24 = dVar24 + local_d8;
            uVar13 = uVar13 + 1;
            bVar19 = d1 <= uVar13;
          } while (uVar13 != d1);
        }
        if (iVar6 == 0) {
          dVar24 = dVar24 - (double)node_wt_ent;
        }
        if ((bVar19) && (local_98 < dVar24)) {
          local_a8 = local_e8;
          local_ac = (uint)local_90;
          local_98 = dVar24;
          uVar18 = local_e4;
        }
      }
      local_90 = local_90 + 1;
    } while (local_90 != n_all_q);
  }
  pqVar14 = (quest_t *)0x0;
  fVar23 = 0.0;
  if ((uVar18 != 0) && (local_a8 != 0)) {
    ptr = __ckd_calloc__((ulong)uVar18,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                         ,0x112);
    ptr_00 = __ckd_calloc__((ulong)local_a8,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                            ,0x113);
    sVar11 = d1 * d2 * uVar9 * 4;
    local_f0 = 0;
    memset(*(void **)*inptr,0,sVar11);
    memset(*(void **)*inptr_00,0,sVar11);
    if (n_id != 0) {
      uVar13 = 0;
      uVar18 = 0;
      do {
        uVar15 = id[uVar13];
        iVar7 = eval_quest(all_q + local_ac,dfeat[uVar15],n_dfeat);
        if (iVar7 == 0) {
          if (n_state != 0) {
            uVar10 = 0;
            do {
              if (n_stream != 0) {
                uVar12 = 0;
                do {
                  if (n_density != 0) {
                    pfVar2 = mixw[uVar15][uVar10][uVar12];
                    lVar16 = *(long *)(inptr_00[uVar10] + uVar12 * 8);
                    uVar17 = 0;
                    do {
                      *(float *)(lVar16 + uVar17 * 4) =
                           (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar9 != uVar17);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != d2);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != d1);
          }
          *(uint *)((long)ptr_00 + local_f0 * 4) = uVar15;
          local_f0 = (ulong)((int)local_f0 + 1);
        }
        else {
          if (n_state != 0) {
            uVar10 = 0;
            do {
              if (n_stream != 0) {
                uVar12 = 0;
                do {
                  if (n_density != 0) {
                    pfVar2 = mixw[uVar15][uVar10][uVar12];
                    lVar16 = *(long *)(inptr[uVar10] + uVar12 * 8);
                    uVar17 = 0;
                    do {
                      *(float *)(lVar16 + uVar17 * 4) =
                           (float)pfVar2[uVar17] + *(float *)(lVar16 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar9 != uVar17);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != d2);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != d1);
          }
          *(uint *)((long)ptr + (ulong)uVar18 * 4) = uVar15;
          uVar18 = uVar18 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != n_id);
    }
    ckd_free_3d(inptr);
    ckd_free(ptr);
    ckd_free_3d(inptr_00);
    ckd_free(ptr_00);
    if (iVar6 == 0) {
      ckd_free_3d(local_b8);
      ckd_free_3d(local_c0);
      ckd_free_3d(local_c8);
      ckd_free_3d(local_d0);
    }
    pqVar14 = all_q + local_ac;
    fVar23 = (float64)local_98;
  }
  *out_best_q = pqVar14;
  return fVar23;
}

Assistant:

float64
best_q(float32 ****mixw,
       float32 ****means,
       float32 ****vars,
       uint32  *veclen,
       uint32 n_model,
       uint32 n_state,
       uint32 n_stream,
       uint32 n_density,
       float32 *stwt,
       uint32 **dfeat,
       uint32 n_dfeat,
       quest_t *all_q,
       uint32 n_all_q,
       pset_t *pset,
       uint32 *id,
       uint32 n_id,
       float32 ***dist,
       float64 node_wt_ent,  /* Weighted entropy of node */
       quest_t **out_best_q)
{
    float32 ***yes_dist;
    float32 ***yes_means=0;
    float32 ***yes_vars=0;
    float32 varfloor=0;
    float64 y_ent;
    float64 yes_dnom, yes_norm;
    uint32 *yes_id;
    float32 ***no_dist;
    float32 ***no_means=0;
    float32 ***no_vars=0;
    float64 n_ent;
    float64 no_dnom, no_norm;
    uint32 *no_id;
    uint32 n_yes, n_b_yes = 0;
    uint32 n_no, n_b_no = 0;
    uint32 i, j, k, q, b_q=0, s;
    uint32 ii;
    float64 einc, b_einc = -1.0e+50;

    const char*  type;
    uint32 continuous, sumveclen=0;

    type = cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0)
        continuous = 1;
    else
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Allocating for sumveclen is overallocation, but it eases coding */
        for (ii=0,sumveclen=0;ii<n_stream;ii++) sumveclen += veclen[ii];
        yes_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        yes_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    n_yes = n_no = 0;

    yes_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    no_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    for (q = 0; q < n_all_q; q++) {
	memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
	memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);

        if (continuous == 1) {
	    memset(&yes_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&yes_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
        }

	n_yes = n_no = 0;

	for (ii = 0; ii < n_id; ii++) {
	    i = id[ii];
	    if (eval_quest(&all_q[q], dfeat[i], n_dfeat)) {
	        for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    yes_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                yes_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                yes_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_yes;
	    }
	    else {
		for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    no_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                no_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                no_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_no;
	    }
	}
	
	if ((n_yes == 0) || (n_no == 0)) {
	    /* no split.  All satisfy or all don't satisfy */
	    continue;
	}


	for (s = 0, einc = 0; s < n_state; s++) {
	    for (k = 0, yes_dnom = 0; k < n_density; k++) {
		yes_dnom += yes_dist[s][0][k];
	    }
	
	    if (yes_dnom == 0)
	      break;

	    yes_norm = 1.0 / yes_dnom;
	
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    yes_dist[s][j][k] *= yes_norm;
		}
	    }
	
	    for (k = 0, no_dnom = 0; k < n_density; k++) {
		no_dnom += no_dist[s][0][k];
	    }
	
	    if (no_dnom == 0)
	      break;

	    no_norm = 1.0 / no_dnom;
	    
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    no_dist[s][j][k] *= no_norm;
		}
	    }

            if (continuous == 1) {
                y_ent = 0;
                n_ent = 0;
	        for (j = 0; j < n_stream; j++) {
                    if (yes_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            yes_means[s][j][k] *= yes_norm;
                            yes_vars[s][j][k] = yes_vars[s][j][k]*yes_norm - 
                                          yes_means[s][j][k]*yes_means[s][j][k];
                            if (yes_vars[s][j][k] < varfloor) yes_vars[s][j][k] = varfloor;
                        }
                    }
                    if (no_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            no_means[s][j][k] *= no_norm;
                            no_vars[s][j][k] = no_vars[s][j][k]*no_norm - 
                                            no_means[s][j][k]*no_means[s][j][k];
                            if (no_vars[s][j][k] < varfloor) no_vars[s][j][k] = varfloor;
                        }
                    }
                    y_ent +=  yes_dnom * ent_cont(yes_means[s][j],yes_vars[s][j],veclen[j]);
                    n_ent +=  no_dnom * ent_cont(no_means[s][j],no_vars[s][j],veclen[j]);
                }
                einc += (float64)stwt[s] * (y_ent + n_ent);
            }
            else {
	        einc += (float64)stwt[s] * wt_ent_inc(yes_dist[s], yes_dnom,
	    				     no_dist[s], no_dnom,
					     dist[s], n_stream, n_density);
            }
	}

        if (continuous == 1) {
            einc -=  node_wt_ent;
        }

	if (s < n_state) {
	  /* Ended iteration over states prematurely; assume 'bad' question */
	  continue;
	}
	
	if (einc > b_einc) {
	    b_einc = einc;
	    b_q = q;
	    n_b_yes = n_yes;
	    n_b_no = n_no;
	}
    }

    if ((n_b_yes == 0) || (n_b_no == 0)) {
	/* No best question */
	*out_best_q = NULL;

	return 0;
    }

    yes_id = (uint32 *)ckd_calloc(n_b_yes, sizeof(uint32));
    no_id  = (uint32 *)ckd_calloc(n_b_no, sizeof(uint32));

    memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    n_yes = n_no = 0;

    for (ii = 0; ii < n_id; ii++) {
	i = id[ii];
	if (eval_quest(&all_q[b_q], dfeat[i], n_dfeat)) {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			yes_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    yes_id[n_yes] = i;
	    ++n_yes;
	}
	else {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			no_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    no_id[n_no] = i;
	    ++n_no;
	}
    }
    
    ckd_free_3d((void ***)yes_dist);
    ckd_free((void *)yes_id);
    ckd_free_3d((void ***)no_dist);
    ckd_free((void *)no_id);

    if (continuous == 1) {
        ckd_free_3d((void ***)yes_means);
        ckd_free_3d((void ***)yes_vars);
        ckd_free_3d((void ***)no_means);
        ckd_free_3d((void ***)no_vars);
    }

    *out_best_q = &all_q[b_q];

    return b_einc;
}